

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coda-mem-cursor.c
# Opt level: O1

int coda_mem_cursor_read_int8_partial_array(coda_cursor *cursor,long offset,long length,int8_t *dst)

{
  coda_backend cVar1;
  coda_dynamic_type_struct *pcVar2;
  int iVar3;
  long lVar4;
  coda_cursor array_cursor;
  coda_cursor local_340;
  
  pcVar2 = cursor->stack[(long)cursor->n + -1].type;
  cVar1 = pcVar2[1].backend;
  if (cVar1 == 2) {
    iVar3 = **(int **)(pcVar2->definition + 1);
    if (iVar3 == 0) {
      memcpy(&local_340,cursor,0x310);
      if (0 < length) {
        iVar3 = coda_cursor_goto_array_element_by_index(&local_340,offset);
        if (iVar3 != 0) {
          return -1;
        }
        lVar4 = 0;
        do {
          iVar3 = coda_ascii_cursor_read_int8(&local_340,dst + lVar4);
          if (iVar3 != 0) {
            return -1;
          }
          if ((lVar4 < length + -1) &&
             (iVar3 = coda_cursor_goto_next_array_element(&local_340), iVar3 != 0)) {
            return -1;
          }
          lVar4 = lVar4 + 1;
        } while (length != lVar4);
      }
    }
    else {
      if (iVar3 != 1) {
        __assert_fail("((coda_type_array *)type->definition)->base_type->format == coda_format_ascii"
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-mem-cursor.c"
                      ,0x3e5,
                      "int coda_mem_cursor_read_int8_partial_array(const coda_cursor *, long, long, int8_t *)"
                     );
      }
      memcpy(&local_340,cursor,0x310);
      if (0 < length) {
        iVar3 = coda_cursor_goto_array_element_by_index(&local_340,offset);
        if (iVar3 != 0) {
          return -1;
        }
        lVar4 = 0;
        do {
          iVar3 = coda_bin_cursor_read_int8(&local_340,dst + lVar4);
          if (iVar3 != 0) {
            return -1;
          }
          if ((lVar4 < length + -1) &&
             (iVar3 = coda_cursor_goto_next_array_element(&local_340), iVar3 != 0)) {
            return -1;
          }
          lVar4 = lVar4 + 1;
        } while (length != lVar4);
      }
    }
  }
  else {
    if (cVar1 != coda_backend_binary) {
      __assert_fail("type->tag == tag_mem_data",
                    "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-mem-cursor.c"
                    ,0x3df,
                    "int coda_mem_cursor_read_int8_partial_array(const coda_cursor *, long, long, int8_t *)"
                   );
    }
    memcpy(&local_340,cursor,0x310);
    if (0 < length) {
      iVar3 = coda_cursor_goto_array_element_by_index(&local_340,offset);
      if (iVar3 != 0) {
        return -1;
      }
      lVar4 = 0;
      do {
        iVar3 = coda_cursor_read_int8(&local_340,dst + lVar4);
        if (iVar3 != 0) {
          return -1;
        }
        if ((lVar4 < length + -1) &&
           (iVar3 = coda_cursor_goto_next_array_element(&local_340), iVar3 != 0)) {
          return -1;
        }
        lVar4 = lVar4 + 1;
      } while (length != lVar4);
    }
  }
  return 0;
}

Assistant:

int coda_mem_cursor_read_int8_partial_array(const coda_cursor *cursor, long offset, long length, int8_t *dst)
{
    coda_mem_type *type = (coda_mem_type *)cursor->stack[cursor->n - 1].type;

    if (type->tag == tag_mem_array)
    {
        return read_partial_array(cursor, (read_function)&coda_cursor_read_int8, offset, length, (uint8_t *)dst,
                                  sizeof(int8_t));
    }
    assert(type->tag == tag_mem_data);
    if (((coda_type_array *)type->definition)->base_type->format == coda_format_binary)
    {
        return read_partial_array(cursor, (read_function)&coda_bin_cursor_read_int8, offset, length, (uint8_t *)dst,
                                  sizeof(int8_t));
    }
    assert(((coda_type_array *)type->definition)->base_type->format == coda_format_ascii);
    return read_partial_array(cursor, (read_function)&coda_ascii_cursor_read_int8, offset, length, (uint8_t *)dst,
                              sizeof(int8_t));
}